

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::IsInternallyOn(char *val)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  reference pcVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  iterator c;
  allocator local_39;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  char *val_local;
  
  if (val == (char *)0x0) {
    val_local._7_1_ = false;
  }
  else {
    v.field_2._8_8_ = val;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_38,val,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    uVar3 = std::__cxx11::string::size();
    if (uVar3 < 5) {
      local_58._M_current = (char *)std::__cxx11::string::begin();
      while( true ) {
        local_60._M_current = (char *)std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
        if (!bVar1) break;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_58);
        iVar2 = toupper((int)*pcVar4);
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_58);
        *pcVar4 = (char)iVar2;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_58,0);
      }
      val_local._7_1_ =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_38,"I_ON");
    }
    else {
      val_local._7_1_ = false;
    }
    c._M_current._0_4_ = 1;
    std::__cxx11::string::~string((string *)local_38);
  }
  return val_local._7_1_;
}

Assistant:

bool cmSystemTools::IsInternallyOn(const char* val)
{
  if (!val)
    {
    return false;
    }
  std::basic_string<char> v = val;
  if (v.size() > 4)
    {
    return false;
    }

  for(std::basic_string<char>::iterator c = v.begin();
      c != v.end(); c++)
    {
    *c = static_cast<char>(toupper(*c));
    }
  return v == "I_ON";
}